

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

iterator __thiscall
google::protobuf::RepeatedField<long>::erase
          (RepeatedField<long> *this,const_iterator first,const_iterator last)

{
  void *__dest;
  void *pvVar1;
  long lVar2;
  size_t __n;
  
  pvVar1 = this->arena_or_elements_;
  if (first == last) {
    lVar2 = (long)(int)((ulong)((long)first - (long)pvVar1) >> 3);
  }
  else {
    lVar2 = (long)(int)((ulong)((long)first - (long)pvVar1) >> 3);
    __dest = (void *)((long)pvVar1 + lVar2 * 8);
    __n = (long)pvVar1 + ((long)this->current_size_ * 8 - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
      pvVar1 = this->arena_or_elements_;
    }
    Truncate(this,(int)((long)__dest + (__n - (long)pvVar1) >> 3));
    pvVar1 = this->arena_or_elements_;
  }
  return (iterator)((long)pvVar1 + lVar2 * 8);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}